

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator<<(short lhs,
          SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits
          )

{
  undefined6 in_register_0000003a;
  
  if (bits.m_int < '\0') {
    __assert_fail("!std::numeric_limits< T >::is_signed || (T)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1b09,
                  "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = char, U = short, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
                 );
  }
  if ((byte)bits.m_int < 0x10) {
    return (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
           (short)((int)CONCAT62(in_register_0000003a,lhs) << (bits.m_int & 0x1fU));
  }
  __assert_fail("(T)bits < (int)safeint_internal::int_traits< U >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1b0a,
                "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = char, U = short, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< U, E > operator <<( U lhs, SafeInt< T, E > bits ) SAFEINT_NOTHROW
{
    ShiftAssert( !std::numeric_limits< T >::is_signed || (T)bits >= 0 );
    ShiftAssert( (T)bits < (int)safeint_internal::int_traits< U >::bitCount );

    return SafeInt< U, E >( (U)( lhs << (T)bits ) );
}